

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O0

Blob * jbcoin::generateRootDeterministicPublicKey(Blob *__return_storage_ptr__,uint128 *seed)

{
  ec_point local_40;
  ec_point pubKey;
  bignum local_28;
  bignum privKey;
  bn_ctx ctx;
  uint128 *seed_local;
  
  openssl::bn_ctx::bn_ctx((bn_ctx *)&privKey);
  generateRootDeterministicKey((jbcoin *)&local_28,seed);
  openssl::multiply((openssl *)&local_40,openssl::secp256k1curve,&local_28,(bn_ctx *)&privKey);
  openssl::bignum::clear(&local_28);
  serialize_ec_point(__return_storage_ptr__,&local_40);
  openssl::ec_point::~ec_point(&local_40);
  openssl::bignum::~bignum(&local_28);
  openssl::bn_ctx::~bn_ctx((bn_ctx *)&privKey);
  return __return_storage_ptr__;
}

Assistant:

Blob generateRootDeterministicPublicKey (uint128 const& seed)
{
    bn_ctx ctx;

    bignum privKey = generateRootDeterministicKey (seed);

    // compute the corresponding public key point
    ec_point pubKey = multiply (secp256k1curve.group, privKey, ctx);

    privKey.clear();  // security erase

    return serialize_ec_point (pubKey);
}